

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O0

int If_ManSortCompare(If_Man_t *p,If_Cut_t *pC0,If_Cut_t *pC1)

{
  If_Cut_t *pC1_local;
  If_Cut_t *pC0_local;
  If_Man_t *p_local;
  
  if (p->pPars->fPower == 0) {
    if (p->SortMode == 1) {
      if (pC1->Area - p->fEpsilon <= pC0->Area) {
        if (pC0->Area <= pC1->Area + p->fEpsilon) {
          if (pC1->Edge - p->fEpsilon <= pC0->Edge) {
            if (pC0->Edge <= pC1->Edge + p->fEpsilon) {
              if (pC1->Power - p->fEpsilon <= pC0->Power) {
                if (pC0->Power <= pC1->Power + p->fEpsilon) {
                  if (*(uint *)&pC0->field_0x1c >> 0x18 < *(uint *)&pC1->field_0x1c >> 0x18) {
                    p_local._4_4_ = -1;
                  }
                  else if (*(uint *)&pC1->field_0x1c >> 0x18 < *(uint *)&pC0->field_0x1c >> 0x18) {
                    p_local._4_4_ = 1;
                  }
                  else if (pC1->Delay - p->fEpsilon <= pC0->Delay) {
                    if (pC0->Delay <= pC1->Delay + p->fEpsilon) {
                      p_local._4_4_ = 0;
                    }
                    else {
                      p_local._4_4_ = 1;
                    }
                  }
                  else {
                    p_local._4_4_ = -1;
                  }
                }
                else {
                  p_local._4_4_ = 1;
                }
              }
              else {
                p_local._4_4_ = -1;
              }
            }
            else {
              p_local._4_4_ = 1;
            }
          }
          else {
            p_local._4_4_ = -1;
          }
        }
        else {
          p_local._4_4_ = 1;
        }
      }
      else {
        p_local._4_4_ = -1;
      }
    }
    else if (p->SortMode == 0) {
      if (pC1->Delay - p->fEpsilon <= pC0->Delay) {
        if (pC0->Delay <= pC1->Delay + p->fEpsilon) {
          if (*(uint *)&pC0->field_0x1c >> 0x18 < *(uint *)&pC1->field_0x1c >> 0x18) {
            p_local._4_4_ = -1;
          }
          else if (*(uint *)&pC1->field_0x1c >> 0x18 < *(uint *)&pC0->field_0x1c >> 0x18) {
            p_local._4_4_ = 1;
          }
          else if (pC1->Area - p->fEpsilon <= pC0->Area) {
            if (pC0->Area <= pC1->Area + p->fEpsilon) {
              if (pC1->Edge - p->fEpsilon <= pC0->Edge) {
                if (pC0->Edge <= pC1->Edge + p->fEpsilon) {
                  if (pC1->Power - p->fEpsilon <= pC0->Power) {
                    if (pC0->Power <= pC1->Power + p->fEpsilon) {
                      p_local._4_4_ = 0;
                    }
                    else {
                      p_local._4_4_ = 1;
                    }
                  }
                  else {
                    p_local._4_4_ = -1;
                  }
                }
                else {
                  p_local._4_4_ = 1;
                }
              }
              else {
                p_local._4_4_ = -1;
              }
            }
            else {
              p_local._4_4_ = 1;
            }
          }
          else {
            p_local._4_4_ = -1;
          }
        }
        else {
          p_local._4_4_ = 1;
        }
      }
      else {
        p_local._4_4_ = -1;
      }
    }
    else {
      if (p->SortMode != 2) {
        __assert_fail("p->SortMode == 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifCut.c"
                      ,0x27d,"int If_ManSortCompare(If_Man_t *, If_Cut_t *, If_Cut_t *)");
      }
      if (pC1->Delay - p->fEpsilon <= pC0->Delay) {
        if (pC0->Delay <= pC1->Delay + p->fEpsilon) {
          if (pC1->Area - p->fEpsilon <= pC0->Area) {
            if (pC0->Area <= pC1->Area + p->fEpsilon) {
              if (pC1->Edge - p->fEpsilon <= pC0->Edge) {
                if (pC0->Edge <= pC1->Edge + p->fEpsilon) {
                  if (pC1->Power - p->fEpsilon <= pC0->Power) {
                    if (pC0->Power <= pC1->Power + p->fEpsilon) {
                      if (*(uint *)&pC0->field_0x1c >> 0x18 < *(uint *)&pC1->field_0x1c >> 0x18) {
                        p_local._4_4_ = -1;
                      }
                      else if (*(uint *)&pC1->field_0x1c >> 0x18 < *(uint *)&pC0->field_0x1c >> 0x18
                              ) {
                        p_local._4_4_ = 1;
                      }
                      else {
                        p_local._4_4_ = 0;
                      }
                    }
                    else {
                      p_local._4_4_ = 1;
                    }
                  }
                  else {
                    p_local._4_4_ = -1;
                  }
                }
                else {
                  p_local._4_4_ = 1;
                }
              }
              else {
                p_local._4_4_ = -1;
              }
            }
            else {
              p_local._4_4_ = 1;
            }
          }
          else {
            p_local._4_4_ = -1;
          }
        }
        else {
          p_local._4_4_ = 1;
        }
      }
      else {
        p_local._4_4_ = -1;
      }
    }
  }
  else if (p->SortMode == 1) {
    if (pC1->Area - p->fEpsilon <= pC0->Area) {
      if (pC0->Area <= pC1->Area + p->fEpsilon) {
        if (pC1->Power - p->fEpsilon <= pC0->Power) {
          if (pC0->Power <= pC1->Power + p->fEpsilon) {
            if (pC1->Edge - p->fEpsilon <= pC0->Edge) {
              if (pC0->Edge <= pC1->Edge + p->fEpsilon) {
                if (*(uint *)&pC0->field_0x1c >> 0x18 < *(uint *)&pC1->field_0x1c >> 0x18) {
                  p_local._4_4_ = -1;
                }
                else if (*(uint *)&pC1->field_0x1c >> 0x18 < *(uint *)&pC0->field_0x1c >> 0x18) {
                  p_local._4_4_ = 1;
                }
                else if (pC1->Delay - p->fEpsilon <= pC0->Delay) {
                  if (pC0->Delay <= pC1->Delay + p->fEpsilon) {
                    p_local._4_4_ = 0;
                  }
                  else {
                    p_local._4_4_ = 1;
                  }
                }
                else {
                  p_local._4_4_ = -1;
                }
              }
              else {
                p_local._4_4_ = 1;
              }
            }
            else {
              p_local._4_4_ = -1;
            }
          }
          else {
            p_local._4_4_ = 1;
          }
        }
        else {
          p_local._4_4_ = -1;
        }
      }
      else {
        p_local._4_4_ = 1;
      }
    }
    else {
      p_local._4_4_ = -1;
    }
  }
  else if (p->SortMode == 0) {
    if (pC1->Delay - p->fEpsilon <= pC0->Delay) {
      if (pC0->Delay <= pC1->Delay + p->fEpsilon) {
        if (*(uint *)&pC0->field_0x1c >> 0x18 < *(uint *)&pC1->field_0x1c >> 0x18) {
          p_local._4_4_ = -1;
        }
        else if (*(uint *)&pC1->field_0x1c >> 0x18 < *(uint *)&pC0->field_0x1c >> 0x18) {
          p_local._4_4_ = 1;
        }
        else if (pC1->Area - p->fEpsilon <= pC0->Area) {
          if (pC0->Area <= pC1->Area + p->fEpsilon) {
            if (pC1->Power - p->fEpsilon <= pC0->Power) {
              if (pC0->Power <= pC1->Power + p->fEpsilon) {
                if (pC1->Edge - p->fEpsilon <= pC0->Edge) {
                  if (pC0->Edge <= pC1->Edge + p->fEpsilon) {
                    p_local._4_4_ = 0;
                  }
                  else {
                    p_local._4_4_ = 1;
                  }
                }
                else {
                  p_local._4_4_ = -1;
                }
              }
              else {
                p_local._4_4_ = 1;
              }
            }
            else {
              p_local._4_4_ = -1;
            }
          }
          else {
            p_local._4_4_ = 1;
          }
        }
        else {
          p_local._4_4_ = -1;
        }
      }
      else {
        p_local._4_4_ = 1;
      }
    }
    else {
      p_local._4_4_ = -1;
    }
  }
  else {
    if (p->SortMode != 2) {
      __assert_fail("p->SortMode == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifCut.c"
                    ,0x230,"int If_ManSortCompare(If_Man_t *, If_Cut_t *, If_Cut_t *)");
    }
    if (pC1->Delay - p->fEpsilon <= pC0->Delay) {
      if (pC0->Delay <= pC1->Delay + p->fEpsilon) {
        if (pC1->Power - p->fEpsilon <= pC0->Power) {
          if (pC0->Power <= pC1->Power + p->fEpsilon) {
            if (pC1->Edge - p->fEpsilon <= pC0->Edge) {
              if (pC0->Edge <= pC1->Edge + p->fEpsilon) {
                if (pC1->Area - p->fEpsilon <= pC0->Area) {
                  if (pC0->Area <= pC1->Area + p->fEpsilon) {
                    if (*(uint *)&pC0->field_0x1c >> 0x18 < *(uint *)&pC1->field_0x1c >> 0x18) {
                      p_local._4_4_ = -1;
                    }
                    else if (*(uint *)&pC1->field_0x1c >> 0x18 < *(uint *)&pC0->field_0x1c >> 0x18)
                    {
                      p_local._4_4_ = 1;
                    }
                    else {
                      p_local._4_4_ = 0;
                    }
                  }
                  else {
                    p_local._4_4_ = 1;
                  }
                }
                else {
                  p_local._4_4_ = -1;
                }
              }
              else {
                p_local._4_4_ = 1;
              }
            }
            else {
              p_local._4_4_ = -1;
            }
          }
          else {
            p_local._4_4_ = 1;
          }
        }
        else {
          p_local._4_4_ = -1;
        }
      }
      else {
        p_local._4_4_ = 1;
      }
    }
    else {
      p_local._4_4_ = -1;
    }
  }
  return p_local._4_4_;
}

Assistant:

static inline int If_ManSortCompare( If_Man_t * p, If_Cut_t * pC0, If_Cut_t * pC1 )
{
    if ( p->pPars->fPower )
    {
        if ( p->SortMode == 1 ) // area flow       
        {
            if ( pC0->Area < pC1->Area - p->fEpsilon )
                return -1;
            if ( pC0->Area > pC1->Area + p->fEpsilon )
                return 1;
            //Abc_Print( 1,"area(%.2f, %.2f), power(%.2f, %.2f), edge(%.2f, %.2f)\n",
            //         pC0->Area, pC1->Area, pC0->Power, pC1->Power, pC0->Edge, pC1->Edge);
            if ( pC0->Power < pC1->Power - p->fEpsilon )
                return -1;
            if ( pC0->Power > pC1->Power + p->fEpsilon )
                return 1;
            if ( pC0->Edge < pC1->Edge - p->fEpsilon )
                return -1;
            if ( pC0->Edge > pC1->Edge + p->fEpsilon )
                return 1;
//            if ( pC0->AveRefs > pC1->AveRefs )
//                return -1;
//            if ( pC0->AveRefs < pC1->AveRefs )
//                return 1;
            if ( pC0->nLeaves < pC1->nLeaves )
                return -1;
            if ( pC0->nLeaves > pC1->nLeaves )
                return 1;
            if ( pC0->Delay < pC1->Delay - p->fEpsilon )
                return -1;
            if ( pC0->Delay > pC1->Delay + p->fEpsilon )
                return 1;
            return 0;
        }
        if ( p->SortMode == 0 ) // delay
        {
            if ( pC0->Delay < pC1->Delay - p->fEpsilon )
                return -1;
            if ( pC0->Delay > pC1->Delay + p->fEpsilon )
                return 1;
            if ( pC0->nLeaves < pC1->nLeaves )
                return -1;
            if ( pC0->nLeaves > pC1->nLeaves )
                return 1;
            if ( pC0->Area < pC1->Area - p->fEpsilon )
                return -1;
            if ( pC0->Area > pC1->Area + p->fEpsilon )
                return 1;
            if ( pC0->Power < pC1->Power - p->fEpsilon  )
                return -1;
            if ( pC0->Power > pC1->Power + p->fEpsilon  )
                return 1;
            if ( pC0->Edge < pC1->Edge - p->fEpsilon )
                return -1;
            if ( pC0->Edge > pC1->Edge + p->fEpsilon )
                return 1;
            return 0;
        }
        assert( p->SortMode == 2 ); // delay old, exact area
        if ( pC0->Delay < pC1->Delay - p->fEpsilon )
            return -1;
        if ( pC0->Delay > pC1->Delay + p->fEpsilon )
            return 1;
        if ( pC0->Power < pC1->Power - p->fEpsilon  )
            return -1;
        if ( pC0->Power > pC1->Power + p->fEpsilon  )
            return 1;
        if ( pC0->Edge < pC1->Edge - p->fEpsilon )
            return -1;
        if ( pC0->Edge > pC1->Edge + p->fEpsilon )
            return 1;
        if ( pC0->Area < pC1->Area - p->fEpsilon )
            return -1;
        if ( pC0->Area > pC1->Area + p->fEpsilon )
            return 1;
        if ( pC0->nLeaves < pC1->nLeaves )
            return -1;
        if ( pC0->nLeaves > pC1->nLeaves )
            return 1;
        return 0;
    } 
    else  // regular
    {
        if ( p->SortMode == 1 ) // area
        {
            if ( pC0->Area < pC1->Area - p->fEpsilon )
                return -1;
            if ( pC0->Area > pC1->Area + p->fEpsilon )
                return 1;
            if ( pC0->Edge < pC1->Edge - p->fEpsilon )
                return -1;
            if ( pC0->Edge > pC1->Edge + p->fEpsilon )
                return 1;
            if ( pC0->Power < pC1->Power - p->fEpsilon )
                return -1;
            if ( pC0->Power > pC1->Power + p->fEpsilon )
                return 1;
//            if ( pC0->AveRefs > pC1->AveRefs )
//                return -1;
//            if ( pC0->AveRefs < pC1->AveRefs )
//                return 1;
            if ( pC0->nLeaves < pC1->nLeaves )
                return -1;
            if ( pC0->nLeaves > pC1->nLeaves )
                return 1;
            if ( pC0->Delay < pC1->Delay - p->fEpsilon )
                return -1;
            if ( pC0->Delay > pC1->Delay + p->fEpsilon )
                return 1;
            return 0;
        }
        if ( p->SortMode == 0 ) // delay
        {
            if ( pC0->Delay < pC1->Delay - p->fEpsilon )
                return -1;
            if ( pC0->Delay > pC1->Delay + p->fEpsilon )
                return 1;
            if ( pC0->nLeaves < pC1->nLeaves )
                return -1;
            if ( pC0->nLeaves > pC1->nLeaves )
                return 1;
            if ( pC0->Area < pC1->Area - p->fEpsilon )
                return -1;
            if ( pC0->Area > pC1->Area + p->fEpsilon )
                return 1;
            if ( pC0->Edge < pC1->Edge - p->fEpsilon )
                return -1;
            if ( pC0->Edge > pC1->Edge + p->fEpsilon )
                return 1;
            if ( pC0->Power < pC1->Power - p->fEpsilon )
                return -1;
            if ( pC0->Power > pC1->Power + p->fEpsilon )
                return 1;
            return 0;
        }
        assert( p->SortMode == 2 ); // delay old
        if ( pC0->Delay < pC1->Delay - p->fEpsilon )
            return -1;
        if ( pC0->Delay > pC1->Delay + p->fEpsilon )
            return 1;
        if ( pC0->Area < pC1->Area - p->fEpsilon )
            return -1;
        if ( pC0->Area > pC1->Area + p->fEpsilon )
            return 1;
        if ( pC0->Edge < pC1->Edge - p->fEpsilon )
            return -1;
        if ( pC0->Edge > pC1->Edge + p->fEpsilon )
            return 1;
        if ( pC0->Power < pC1->Power - p->fEpsilon )
            return -1;
        if ( pC0->Power > pC1->Power + p->fEpsilon )
            return 1;
        if ( pC0->nLeaves < pC1->nLeaves )
            return -1;
        if ( pC0->nLeaves > pC1->nLeaves )
            return 1;
        return 0;
    }
}